

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglImageUtil.cpp
# Opt level: O0

void __thiscall
deqp::egl::Image::NativeSurface<eglu::NativeWindow>::~NativeSurface
          (NativeSurface<eglu::NativeWindow> *this)

{
  NativeSurface<eglu::NativeWindow> *this_local;
  
  ~NativeSurface(this);
  operator_delete(this,0x28);
  return;
}

Assistant:

explicit		NativeSurface	(MovePtr<UniqueSurface>	surface,
									 MovePtr<T>				native)
						: ManagedSurface	(surface)
						, m_native			(native) {}